

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.c
# Opt level: O3

int mbedtls_mpi_core_fill_random
              (mbedtls_mpi_uint *X,size_t X_limbs,size_t n_bytes,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  ulong *puVar4;
  ulong *puVar5;
  size_t __n;
  ulong uVar6;
  
  uVar6 = ((n_bytes >> 3) + 1) - (ulong)((n_bytes & 7) == 0);
  iVar3 = -4;
  if (uVar6 <= X_limbs) {
    __n = uVar6 * 8 - n_bytes;
    memset(X,0,__n);
    memset(X + uVar6,0,(X_limbs - uVar6) * 8);
    iVar3 = (*f_rng)(p_rng,(uchar *)(__n + (long)X),n_bytes);
    if (iVar3 == 0) {
      puVar4 = X + (uVar6 - 1);
      if (X <= puVar4 && uVar6 != 0) {
        puVar5 = X + 1;
        do {
          uVar6 = puVar5[-1];
          uVar1 = *puVar4;
          puVar5[-1] = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 |
                       (uVar1 & 0xff0000000000) >> 0x18 | (uVar1 & 0xff00000000) >> 8 |
                       (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
                       (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
          *puVar4 = uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 |
                    (uVar6 & 0xff0000000000) >> 0x18 | (uVar6 & 0xff00000000) >> 8 |
                    (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
                    (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
          puVar4 = puVar4 + -1;
          bVar2 = puVar5 <= puVar4;
          puVar5 = puVar5 + 1;
        } while (bVar2);
      }
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int mbedtls_mpi_core_fill_random(
    mbedtls_mpi_uint *X, size_t X_limbs,
    size_t n_bytes,
    int (*f_rng)(void *, unsigned char *, size_t), void *p_rng)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    const size_t limbs = CHARS_TO_LIMBS(n_bytes);
    const size_t overhead = (limbs * ciL) - n_bytes;

    if (X_limbs < limbs) {
        return MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
    }

    memset(X, 0, overhead);
    memset((unsigned char *) X + limbs * ciL, 0, (X_limbs - limbs) * ciL);
    MBEDTLS_MPI_CHK(f_rng(p_rng, (unsigned char *) X + overhead, n_bytes));
    mbedtls_mpi_core_bigendian_to_host(X, limbs);

cleanup:
    return ret;
}